

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coba.cpp
# Opt level: O1

void fun1(int px,int py)

{
  uint uVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int y;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar7 = 0;
  uVar6 = 100;
  do {
    iVar4 = py + uVar6;
    lVar3 = (long)(int)(py + uVar6 + -100) * -0x66666667;
    cVar2 = ((char)(uint)((ulong)lVar3 >> 0x21) - (char)(lVar3 >> 0x3f)) + -0x38;
    uVar5 = 100;
    do {
      uVar1 = uVar5 - 0xa0;
      if (uVar1 < 0xb && uVar6 < 0xa1) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar1 < 0x29 && uVar6 - 100 < 0xb) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar6 - 0x78 < 0xb && uVar1 < 0x29) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar5 - 0xbe < 0xb && uVar6 < 0xa1) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar5 < 0x97 && uVar6 - 100 < 0xb) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar6 - 0x96 < 0xb && uVar5 < 0x97) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (((((int)(0x95 - uVar7) <= (int)uVar5) && (0x6d < uVar6)) && (uVar7 < 0x31)) &&
         ((int)uVar5 <= (int)(0x9f - uVar7))) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar5 - 0xd2 < 0xb && uVar6 < 0xa1) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (((uVar7 + 0xd3 <= uVar5) && (uVar7 < 0x31)) && (uVar5 <= uVar7 + 0xdd)) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar5 - 0x104 < 0xb && uVar6 < 0xa1) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      bVar8 = uVar5 - 0x118 < 0xb;
      if (bVar8 && uVar6 < 0xa1) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (((uVar7 + 0x119 <= uVar5) && (uVar7 < 0x1d)) && (uVar5 <= uVar7 + 0x123)) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (((((int)(0x153 - uVar7) <= (int)uVar5) && (0x81 < uVar6)) && (uVar7 < 0x3b)) &&
         ((int)uVar5 <= (int)(0x15d - uVar7))) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (bVar8 && uVar6 < 0xa1) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (((uVar7 + 0x119 <= uVar5) && (uVar7 < 0x1d)) && (uVar5 <= uVar7 + 0x123)) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if ((((int)(0x153 - uVar7) <= (int)uVar5) && (0x81 < uVar6)) &&
         ((uVar7 < 0x3b && ((int)uVar5 <= (int)(0x15d - uVar7))))) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar5 - 0x14a < 0xb && uVar6 < 0xa1) {
        FrameBuffer::set(0x1060a8,px + uVar5,iVar4,'\0','d',
                         (char)(((px + uVar5) - ((int)(px + uVar5 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 1000);
    uVar7 = uVar7 + 1;
    uVar6 = uVar6 + 1;
  } while (uVar7 != 900);
  return;
}

Assistant:

void fun1(int px, int py) {
	int i = 0, x, y;
  // Figure out where in memory to put the pixel
  for (y = 100; y < 1000; y++) {
	  i++;
    for (x = 100; x < 1000; x++) {
      if(x>=160&&x<=170&&y<=160){
				setWarna(px+x,py+y);
			}
			if(y>=100&&y<=110&&x>=160&&x<=200){
				setWarna(px+x,py+y);
			}
			if(y>=120&&y<=130&&x>=160&&x<=200){
				setWarna(px+x,py+y);
			}
			if(x>=190&&x<=200&y<=160){
				setWarna(px+x,py+y);
			}
			if(y>=100&&y<=110&&x<=150){
					setWarna(px+x,py+y);
				}
			if(y>=150&&y<=160&&x<=150){
					setWarna(px+x,py+y);
				}
			if(x>=150-i&&x<=160-i&&i<50&&y>=110){
				  setWarna(px+x,py+y);
			}
			if(x>=210&&x<=220&&y<=160){
                setWarna(px+x,py+y);
				}
				
				if(x>=210+i&&x<=220+i&&i<50){
                setWarna(px+x,py+y);
				}

				if(x>=260&&x<=270&y<=160){
                setWarna(px+x,py+y);
				}	
			if(x>=280&&x<=290&&y<=160){
                setWarna(px+x,py+y);
			}
			if(x>=280+i&&x<=290+i&&i<30){
                setWarna(px+x,py+y);
			}
			if(x>=310-(i-30)&&x<=320-(i-30)&&i<60&&y>=130){
                setWarna(px+x,py+y);
			}
			if(x>=280&&x<=290&&y<=160){
                setWarna(px+x,py+y);
			}
			if(x>=280+i&&x<=290+i&&i<30){
                setWarna(px+x,py+y);
			}
			if(x>=310-(i-30)&&x<=320-(i-30)&&i<60&&y>=130){
                setWarna(px+x,py+y);
			}
			if(x>=330&&x<=340&&y<=160){
                setWarna(px+x,py+y);
				}
    }
  }
}